

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O1

void Bac_NtkDeriveFanout(Bac_Ntk_t *p)

{
  Vec_Int_t *p_00;
  byte bVar1;
  int iVar2;
  int i;
  char *pcVar3;
  uint uVar4;
  int *piVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  
  if ((p->vFanout).pArray != (int *)0x0) {
    __assert_fail("!Bac_NtkHasFanouts(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                  ,0xf4,"void Bac_NtkDeriveFanout(Bac_Ntk_t *)");
  }
  iVar2 = (p->vType).nCap;
  lVar8 = (long)iVar2;
  if (lVar8 == 0) {
    __assert_fail("Bac_NtkObjNumAlloc(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                  ,0xfd,"void Bac_NtkStartFanouts(Bac_Ntk_t *)");
  }
  p_00 = &p->vFanout;
  if ((p->vFanout).nCap < iVar2) {
    piVar5 = (int *)malloc(lVar8 * 4);
    (p->vFanout).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = iVar2;
  }
  if (0 < iVar2) {
    memset((p->vFanout).pArray,0,lVar8 << 2);
  }
  (p->vFanout).nSize = iVar2;
  uVar4 = (p->vType).nSize;
  uVar6 = (ulong)uVar4;
  if (0 < (int)uVar4) {
    lVar8 = 0;
    do {
      pcVar3 = (p->vType).pArray;
      if ((pcVar3[lVar8] & 0xfcU) == 4) {
        iVar2 = (p->vFanout).nSize;
        if (iVar2 <= lVar8) goto LAB_003b99ff;
        piVar5 = (p->vFanout).pArray;
        if (piVar5[lVar8] != 0) {
          __assert_fail("!Bac_ObjNextFanout(p, iCo)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                        ,0xf8,"void Bac_NtkDeriveFanout(Bac_Ntk_t *)");
        }
        if ((p->vFanin).nSize <= lVar8) goto LAB_003b99ff;
        i = (p->vFanin).pArray[lVar8];
        lVar7 = (long)i;
        if ((lVar7 < 0) || ((int)uVar6 <= i)) goto LAB_003b9a1e;
        bVar1 = pcVar3[lVar7];
        if ((9 < bVar1) || ((0x30cU >> (bVar1 & 0x1f) & 1) == 0)) {
LAB_003b9a7b:
          __assert_fail("Bac_ObjIsCi(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0x125,"int Bac_ObjFanout(Bac_Ntk_t *, int)");
        }
        if (iVar2 <= i) goto LAB_003b99ff;
        uVar4 = piVar5[lVar7];
        if ((ulong)uVar4 != 0) {
          if ((9 < bVar1) || ((0x30cU >> (bVar1 & 0x1f) & 1) == 0)) goto LAB_003b9a7b;
          if (((int)uVar4 < 0) || ((int)uVar6 <= (int)uVar4)) goto LAB_003b9a1e;
          if ((pcVar3[uVar4] & 0xfcU) != 4) {
            __assert_fail("Bac_ObjIsCo(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                          ,0x128,"void Bac_ObjSetNextFanout(Bac_Ntk_t *, int, int)");
          }
          Vec_IntSetEntry(p_00,uVar4,(int)lVar8);
        }
        if ((p->vType).nSize <= i) goto LAB_003b9a1e;
        uVar4 = (uint)(byte)(p->vType).pArray[lVar7];
        if ((9 < uVar4) || ((0x30cU >> (uVar4 & 0x1f) & 1) == 0)) goto LAB_003b9a9a;
        Vec_IntSetEntry(p_00,i,(int)lVar8);
      }
      lVar8 = lVar8 + 1;
      uVar6 = (ulong)(p->vType).nSize;
    } while (lVar8 < (long)uVar6);
  }
  uVar4 = (p->vType).nSize;
  uVar6 = (ulong)uVar4;
  if (0 < (int)uVar4) {
    lVar8 = 0;
    do {
      pcVar3 = (p->vType).pArray;
      if ((pcVar3[lVar8] & 0xfcU) == 4) {
        if ((p->vFanout).nSize <= lVar8) goto LAB_003b99ff;
        if ((p->vFanout).pArray[lVar8] == 0) {
          if ((p->vFanin).nSize <= lVar8) {
LAB_003b99ff:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar2 = (p->vFanin).pArray[lVar8];
          if (((long)iVar2 < 0) || ((int)uVar6 <= iVar2)) {
LAB_003b9a1e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          uVar4 = (uint)(byte)pcVar3[iVar2];
          if ((9 < uVar4) || ((0x30cU >> (uVar4 & 0x1f) & 1) == 0)) {
LAB_003b9a9a:
            __assert_fail("Bac_ObjIsCi(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                          ,0x127,"void Bac_ObjSetFanout(Bac_Ntk_t *, int, int)");
          }
          Vec_IntSetEntry(p_00,iVar2,(int)lVar8);
        }
      }
      lVar8 = lVar8 + 1;
      uVar6 = (ulong)(p->vType).nSize;
    } while (lVar8 < (long)uVar6);
  }
  return;
}

Assistant:

void Bac_NtkDeriveFanout( Bac_Ntk_t * p )
{
    int iCi, iCo;
    assert( !Bac_NtkHasFanouts(p) );
    Bac_NtkStartFanouts( p );
    Bac_NtkForEachCo( p, iCo )
    {
        assert( !Bac_ObjNextFanout(p, iCo) );
        iCi = Bac_ObjFanin(p, iCo);
        if ( Bac_ObjFanout(p, iCi) )
            Bac_ObjSetNextFanout( p, Bac_ObjFanout(p, iCi), iCo );
        Bac_ObjSetFanout( p, iCi, iCo );
    }
    Bac_NtkForEachCo( p, iCo )
        if ( !Bac_ObjNextFanout(p, iCo) )
            Bac_ObjSetFanout( p, Bac_ObjFanin(p, iCo), iCo );
}